

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *rhs)

{
  float fVar1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  complex<float> *__s;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong __n;
  long lVar7;
  size_type_conflict sVar8;
  long lVar9;
  float fVar11;
  undefined8 uVar10;
  float fVar12;
  float fVar13;
  
  sVar8 = this->size_;
  if (sVar8 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator*=(const SquareMatrix<T> &) [T = std::complex<float>]"
                 );
  }
  if (sVar8 == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x1e,
                  "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<float>]");
  }
  __n = sVar8 * sVar8 * 8;
  __s = (complex<float> *)operator_new__(-(ulong)((ulong)(sVar8 * sVar8) >> 0x3d != 0) | __n);
  memset(__s,0,__n);
  if (0 < sVar8) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (0 < sVar8) {
        lVar9 = 0;
        do {
          if (0 < sVar8) {
            lVar7 = 0;
            do {
              lVar4 = rhs->size_ * lVar6;
              pcVar3 = (rhs->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                       .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
              _Var2 = (this->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [sVar8 * lVar7 + lVar9]._M_value;
              fVar12 = *(float *)((long)&pcVar3[lVar7]._M_value + lVar4);
              fVar1 = *(float *)((long)&pcVar3[lVar7]._M_value + lVar4 + 4);
              fVar11 = (float)(_Var2 >> 0x20);
              fVar13 = fVar12 * (float)_Var2 - fVar11 * fVar1;
              fVar12 = fVar12 * fVar11 + (float)_Var2 * fVar1;
              if ((NAN(fVar13)) && (NAN(fVar12))) {
                uVar10 = __mulsc3(_Var2,fVar11);
                fVar13 = (float)uVar10;
                fVar12 = (float)((ulong)uVar10 >> 0x20);
                sVar8 = this->size_;
              }
              __s[lVar9 + sVar8 * lVar5]._M_value =
                   CONCAT44((float)(__s[lVar9 + sVar8 * lVar5]._M_value >> 0x20) + fVar12,
                            (float)__s[lVar9 + sVar8 * lVar5]._M_value + fVar13);
              lVar7 = lVar7 + 1;
            } while (lVar7 < sVar8);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < sVar8);
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 8;
    } while (lVar5 < sVar8);
  }
  pcVar3 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = __s;
  if (pcVar3 != (complex<float> *)0x0) {
    operator_delete__(pcVar3);
  }
  return this;
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }